

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NodeView.cc
# Opt level: O0

vector<NodeView,_std::allocator<NodeView>_> * __thiscall NodeView::parallels(NodeView *this)

{
  bool bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  reference this_00;
  NodeView *in_RSI;
  vector<NodeView,_std::allocator<NodeView>_> *in_RDI;
  NodeView NVar4;
  NodeView NVar5;
  pair<std::_Rb_tree_const_iterator<long>,_bool> pVar6;
  LinkView *nlv_1;
  iterator __end2_1;
  iterator __begin2_1;
  vector<LinkView,_std::allocator<LinkView>_> *__range2_1;
  LinkView *plv_1;
  iterator __end2;
  iterator __begin2;
  vector<LinkView,_std::allocator<LinkView>_> *__range2;
  set<long,_std::less<long>,_std::allocator<long>_> onnodes;
  set<long,_std::less<long>,_std::allocator<long>_> opnodes;
  LinkView *other;
  iterator __end1_2;
  iterator __begin1_2;
  vector<LinkView,_std::allocator<LinkView>_> *__range1_2;
  LinkView *nlv;
  iterator __end1_1;
  iterator __begin1_1;
  vector<LinkView,_std::allocator<LinkView>_> *__range1_1;
  LinkView *plv;
  iterator __end1;
  iterator __begin1;
  vector<LinkView,_std::allocator<LinkView>_> *__range1;
  set<long,_std::less<long>,_std::allocator<long>_> nnodes;
  set<long,_std::less<long>,_std::allocator<long>_> pnodes;
  vector<LinkView,_std::allocator<LinkView>_> n;
  vector<LinkView,_std::allocator<LinkView>_> p;
  vector<NodeView,_std::allocator<NodeView>_> *pars;
  DistanceGraph *in_stack_fffffffffffffbb8;
  __normal_iterator<LinkView_*,_std::vector<LinkView,_std::allocator<LinkView>_>_>
  *in_stack_fffffffffffffbc0;
  undefined5 in_stack_fffffffffffffbc8;
  undefined1 in_stack_fffffffffffffbcf;
  _Rb_tree_const_iterator<long> in_stack_fffffffffffffbd0;
  value_type *in_stack_fffffffffffffbd8;
  DistanceGraph *in_stack_fffffffffffffbe0;
  NodeView *in_stack_fffffffffffffc58;
  NodeView local_318;
  value_type *local_308;
  reference local_300;
  LinkView *local_2f8;
  __normal_iterator<LinkView_*,_std::vector<LinkView,_std::allocator<LinkView>_>_> local_2f0;
  NodeView local_2e8;
  undefined1 local_2d8 [24];
  undefined1 *local_2c0;
  _Base_ptr local_2b8;
  undefined1 local_2b0;
  NodeView local_2a8;
  sgNodeID_t local_298;
  reference local_290;
  LinkView *local_288;
  __normal_iterator<LinkView_*,_std::vector<LinkView,_std::allocator<LinkView>_>_> local_280;
  NodeView local_278;
  undefined1 local_268 [24];
  undefined1 *local_250;
  NodeView local_1e8;
  reference local_1d8;
  LinkView *local_1d0;
  __normal_iterator<LinkView_*,_std::vector<LinkView,_std::allocator<LinkView>_>_> local_1c8;
  vector<LinkView,_std::allocator<LinkView>_> local_1c0;
  NodeView *local_1a8;
  DistanceGraph *local_1a0;
  undefined1 local_198 [24];
  undefined1 *local_180;
  _Base_ptr local_178;
  undefined1 local_170;
  NodeView local_168;
  sgNodeID_t local_158;
  reference local_150;
  LinkView *local_148;
  __normal_iterator<LinkView_*,_std::vector<LinkView,_std::allocator<LinkView>_>_> local_140;
  undefined1 local_138 [24];
  undefined1 *local_120;
  _Base_ptr local_118;
  undefined1 local_110;
  NodeView local_108;
  sgNodeID_t local_f8;
  reference local_f0;
  LinkView *local_e8;
  __normal_iterator<LinkView_*,_std::vector<LinkView,_std::allocator<LinkView>_>_> local_e0;
  undefined1 local_d8 [24];
  undefined1 *local_c0;
  byte local_51;
  undefined4 local_50;
  NodeView *this_01;
  
  prev(in_stack_fffffffffffffc58);
  next(in_stack_fffffffffffffc58);
  bVar1 = std::vector<LinkView,_std::allocator<LinkView>_>::empty
                    ((vector<LinkView,_std::allocator<LinkView>_> *)
                     in_stack_fffffffffffffbd0._M_node);
  if ((bVar1) ||
     (bVar1 = std::vector<LinkView,_std::allocator<LinkView>_>::empty
                        ((vector<LinkView,_std::allocator<LinkView>_> *)
                         in_stack_fffffffffffffbd0._M_node), bVar1)) {
    memset(in_RDI,0,0x18);
    std::vector<NodeView,_std::allocator<NodeView>_>::vector
              ((vector<NodeView,_std::allocator<NodeView>_> *)0x47bb23);
    local_50 = 1;
  }
  else {
    local_51 = 0;
    std::vector<NodeView,_std::allocator<NodeView>_>::vector
              ((vector<NodeView,_std::allocator<NodeView>_> *)0x47bb61);
    std::set<long,_std::less<long>,_std::allocator<long>_>::set
              ((set<long,_std::less<long>,_std::allocator<long>_> *)0x47bb6e);
    std::set<long,_std::less<long>,_std::allocator<long>_>::set
              ((set<long,_std::less<long>,_std::allocator<long>_> *)0x47bb7b);
    prev(in_stack_fffffffffffffc58);
    local_c0 = local_d8;
    local_e0._M_current =
         (LinkView *)
         std::vector<LinkView,_std::allocator<LinkView>_>::begin
                   ((vector<LinkView,_std::allocator<LinkView>_> *)in_stack_fffffffffffffbb8);
    local_e8 = (LinkView *)
               std::vector<LinkView,_std::allocator<LinkView>_>::end
                         ((vector<LinkView,_std::allocator<LinkView>_> *)in_stack_fffffffffffffbb8);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (in_stack_fffffffffffffbc0,
                         (__normal_iterator<LinkView_*,_std::vector<LinkView,_std::allocator<LinkView>_>_>
                          *)in_stack_fffffffffffffbb8);
      if (!bVar1) break;
      local_f0 = __gnu_cxx::
                 __normal_iterator<LinkView_*,_std::vector<LinkView,_std::allocator<LinkView>_>_>::
                 operator*(&local_e0);
      NVar4 = LinkView::node(local_f0);
      local_108 = NVar4;
      local_f8 = node_id(&local_108);
      pVar6 = std::set<long,_std::less<long>,_std::allocator<long>_>::insert
                        ((set<long,_std::less<long>,_std::allocator<long>_> *)
                         in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8);
      local_118 = (_Base_ptr)pVar6.first._M_node;
      local_110 = pVar6.second;
      __gnu_cxx::__normal_iterator<LinkView_*,_std::vector<LinkView,_std::allocator<LinkView>_>_>::
      operator++(&local_e0);
    }
    local_50 = 2;
    std::vector<LinkView,_std::allocator<LinkView>_>::~vector
              ((vector<LinkView,_std::allocator<LinkView>_> *)in_stack_fffffffffffffbd0._M_node);
    next(in_stack_fffffffffffffc58);
    local_120 = local_138;
    local_140._M_current =
         (LinkView *)
         std::vector<LinkView,_std::allocator<LinkView>_>::begin
                   ((vector<LinkView,_std::allocator<LinkView>_> *)in_stack_fffffffffffffbb8);
    local_148 = (LinkView *)
                std::vector<LinkView,_std::allocator<LinkView>_>::end
                          ((vector<LinkView,_std::allocator<LinkView>_> *)in_stack_fffffffffffffbb8)
    ;
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (in_stack_fffffffffffffbc0,
                         (__normal_iterator<LinkView_*,_std::vector<LinkView,_std::allocator<LinkView>_>_>
                          *)in_stack_fffffffffffffbb8);
      if (!bVar1) break;
      local_150 = __gnu_cxx::
                  __normal_iterator<LinkView_*,_std::vector<LinkView,_std::allocator<LinkView>_>_>::
                  operator*(&local_140);
      NVar4 = LinkView::node(local_150);
      local_168 = NVar4;
      local_158 = node_id(&local_168);
      pVar6 = std::set<long,_std::less<long>,_std::allocator<long>_>::insert
                        ((set<long,_std::less<long>,_std::allocator<long>_> *)
                         in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8);
      local_178 = (_Base_ptr)pVar6.first._M_node;
      local_170 = pVar6.second;
      __gnu_cxx::__normal_iterator<LinkView_*,_std::vector<LinkView,_std::allocator<LinkView>_>_>::
      operator++(&local_140);
    }
    local_50 = 4;
    std::vector<LinkView,_std::allocator<LinkView>_>::~vector
              ((vector<LinkView,_std::allocator<LinkView>_> *)in_stack_fffffffffffffbd0._M_node);
    prev(in_stack_fffffffffffffc58);
    this_00 = std::vector<LinkView,_std::allocator<LinkView>_>::operator[](&local_1c0,0);
    NVar4 = LinkView::node(this_00);
    local_1a0 = NVar4.dg;
    this_01 = (NodeView *)NVar4.id;
    local_1a8 = this_01;
    next(this_01);
    std::vector<LinkView,_std::allocator<LinkView>_>::~vector
              ((vector<LinkView,_std::allocator<LinkView>_> *)in_stack_fffffffffffffbd0._M_node);
    local_180 = local_198;
    local_1c8._M_current =
         (LinkView *)
         std::vector<LinkView,_std::allocator<LinkView>_>::begin
                   ((vector<LinkView,_std::allocator<LinkView>_> *)in_stack_fffffffffffffbb8);
    local_1d0 = (LinkView *)
                std::vector<LinkView,_std::allocator<LinkView>_>::end
                          ((vector<LinkView,_std::allocator<LinkView>_> *)in_stack_fffffffffffffbb8)
    ;
    NVar4.dg = in_stack_fffffffffffffbb8;
    NVar4.id = (sgNodeID_t)in_stack_fffffffffffffbc0;
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<LinkView_*,_std::vector<LinkView,_std::allocator<LinkView>_>_>
                          *)NVar4.id,
                         (__normal_iterator<LinkView_*,_std::vector<LinkView,_std::allocator<LinkView>_>_>
                          *)NVar4.dg);
      if (!bVar1) break;
      local_1d8 = __gnu_cxx::
                  __normal_iterator<LinkView_*,_std::vector<LinkView,_std::allocator<LinkView>_>_>::
                  operator*(&local_1c8);
      NVar5 = LinkView::node(local_1d8);
      local_1e8 = NVar5;
      bVar1 = operator==(&local_1e8,in_RSI);
      if (!bVar1) {
        std::set<long,_std::less<long>,_std::allocator<long>_>::set
                  ((set<long,_std::less<long>,_std::allocator<long>_> *)0x47c056);
        std::set<long,_std::less<long>,_std::allocator<long>_>::set
                  ((set<long,_std::less<long>,_std::allocator<long>_> *)0x47c063);
        NVar5 = LinkView::node(local_1d8);
        local_278 = NVar5;
        prev(this_01);
        local_250 = local_268;
        local_280._M_current =
             (LinkView *)
             std::vector<LinkView,_std::allocator<LinkView>_>::begin
                       ((vector<LinkView,_std::allocator<LinkView>_> *)NVar4.dg);
        local_288 = (LinkView *)
                    std::vector<LinkView,_std::allocator<LinkView>_>::end
                              ((vector<LinkView,_std::allocator<LinkView>_> *)NVar4.dg);
        while( true ) {
          bVar1 = __gnu_cxx::operator!=
                            ((__normal_iterator<LinkView_*,_std::vector<LinkView,_std::allocator<LinkView>_>_>
                              *)NVar4.id,
                             (__normal_iterator<LinkView_*,_std::vector<LinkView,_std::allocator<LinkView>_>_>
                              *)NVar4.dg);
          if (!bVar1) break;
          local_290 = __gnu_cxx::
                      __normal_iterator<LinkView_*,_std::vector<LinkView,_std::allocator<LinkView>_>_>
                      ::operator*(&local_280);
          NVar5 = LinkView::node(local_290);
          local_2a8 = NVar5;
          local_298 = node_id(&local_2a8);
          pVar6 = std::set<long,_std::less<long>,_std::allocator<long>_>::insert
                            ((set<long,_std::less<long>,_std::allocator<long>_> *)
                             in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8);
          local_2b8 = (_Base_ptr)pVar6.first._M_node;
          local_2b0 = pVar6.second;
          __gnu_cxx::
          __normal_iterator<LinkView_*,_std::vector<LinkView,_std::allocator<LinkView>_>_>::
          operator++(&local_280);
        }
        local_50 = 8;
        std::vector<LinkView,_std::allocator<LinkView>_>::~vector
                  ((vector<LinkView,_std::allocator<LinkView>_> *)in_stack_fffffffffffffbd0._M_node)
        ;
        NVar5 = LinkView::node(local_1d8);
        local_2e8 = NVar5;
        next(this_01);
        local_2c0 = local_2d8;
        local_2f0._M_current =
             (LinkView *)
             std::vector<LinkView,_std::allocator<LinkView>_>::begin
                       ((vector<LinkView,_std::allocator<LinkView>_> *)NVar4.dg);
        local_2f8 = (LinkView *)
                    std::vector<LinkView,_std::allocator<LinkView>_>::end
                              ((vector<LinkView,_std::allocator<LinkView>_> *)NVar4.dg);
        while( true ) {
          bVar1 = __gnu_cxx::operator!=
                            ((__normal_iterator<LinkView_*,_std::vector<LinkView,_std::allocator<LinkView>_>_>
                              *)NVar4.id,
                             (__normal_iterator<LinkView_*,_std::vector<LinkView,_std::allocator<LinkView>_>_>
                              *)NVar4.dg);
          if (!bVar1) break;
          local_300 = __gnu_cxx::
                      __normal_iterator<LinkView_*,_std::vector<LinkView,_std::allocator<LinkView>_>_>
                      ::operator*(&local_2f0);
          NVar5 = LinkView::node(local_300);
          in_stack_fffffffffffffbe0 = NVar5.dg;
          local_318 = NVar5;
          in_stack_fffffffffffffbd8 = (value_type *)node_id(&local_318);
          local_308 = in_stack_fffffffffffffbd8;
          pVar6 = std::set<long,_std::less<long>,_std::allocator<long>_>::insert
                            ((set<long,_std::less<long>,_std::allocator<long>_> *)
                             in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8);
          in_stack_fffffffffffffbd0 = pVar6.first._M_node;
          in_stack_fffffffffffffbcf = pVar6.second;
          __gnu_cxx::
          __normal_iterator<LinkView_*,_std::vector<LinkView,_std::allocator<LinkView>_>_>::
          operator++(&local_2f0);
        }
        local_50 = 10;
        std::vector<LinkView,_std::allocator<LinkView>_>::~vector
                  ((vector<LinkView,_std::allocator<LinkView>_> *)in_stack_fffffffffffffbd0._M_node)
        ;
        uVar2 = std::operator==((set<long,_std::less<long>,_std::allocator<long>_> *)NVar4.id,
                                (set<long,_std::less<long>,_std::allocator<long>_> *)NVar4.dg);
        if ((bool)uVar2) {
          uVar3 = std::operator==((set<long,_std::less<long>,_std::allocator<long>_> *)NVar4.id,
                                  (set<long,_std::less<long>,_std::allocator<long>_> *)NVar4.dg);
          if ((bool)uVar3) {
            NVar4 = LinkView::node(local_1d8);
            std::vector<NodeView,_std::allocator<NodeView>_>::push_back
                      ((vector<NodeView,_std::allocator<NodeView>_> *)
                       in_stack_fffffffffffffbd0._M_node,
                       (value_type *)
                       CONCAT17(in_stack_fffffffffffffbcf,
                                CONCAT16(uVar2,CONCAT15(uVar3,in_stack_fffffffffffffbc8))));
          }
        }
        std::set<long,_std::less<long>,_std::allocator<long>_>::~set
                  ((set<long,_std::less<long>,_std::allocator<long>_> *)0x47c443);
        std::set<long,_std::less<long>,_std::allocator<long>_>::~set
                  ((set<long,_std::less<long>,_std::allocator<long>_> *)0x47c450);
      }
      __gnu_cxx::__normal_iterator<LinkView_*,_std::vector<LinkView,_std::allocator<LinkView>_>_>::
      operator++(&local_1c8);
    }
    local_50 = 6;
    std::vector<LinkView,_std::allocator<LinkView>_>::~vector
              ((vector<LinkView,_std::allocator<LinkView>_> *)in_stack_fffffffffffffbd0._M_node);
    local_51 = 1;
    local_50 = 1;
    std::set<long,_std::less<long>,_std::allocator<long>_>::~set
              ((set<long,_std::less<long>,_std::allocator<long>_> *)0x47c4ab);
    std::set<long,_std::less<long>,_std::allocator<long>_>::~set
              ((set<long,_std::less<long>,_std::allocator<long>_> *)0x47c4b8);
    if ((local_51 & 1) == 0) {
      std::vector<NodeView,_std::allocator<NodeView>_>::~vector
                ((vector<NodeView,_std::allocator<NodeView>_> *)in_stack_fffffffffffffbd0._M_node);
    }
  }
  std::vector<LinkView,_std::allocator<LinkView>_>::~vector
            ((vector<LinkView,_std::allocator<LinkView>_> *)in_stack_fffffffffffffbd0._M_node);
  std::vector<LinkView,_std::allocator<LinkView>_>::~vector
            ((vector<LinkView,_std::allocator<LinkView>_> *)in_stack_fffffffffffffbd0._M_node);
  return in_RDI;
}

Assistant:

std::vector<NodeView> NodeView::parallels() const {
    auto p=prev(),n=next();
    if (p.empty() or n.empty()) return {};
    std::vector<NodeView> pars;
    std::set<sgNodeID_t> pnodes,nnodes;
    for (auto &plv:prev()) pnodes.insert(plv.node().node_id());
    for (auto &nlv:next()) nnodes.insert(nlv.node().node_id());
    for (auto &other:prev()[0].node().next()){
        if (other.node()==*this) continue;
        std::set<sgNodeID_t> opnodes,onnodes;
        for (auto &plv:other.node().prev()) opnodes.insert(plv.node().node_id());
        for (auto &nlv:other.node().next()) onnodes.insert(nlv.node().node_id());
        if (pnodes==opnodes and nnodes==onnodes) pars.push_back(other.node());
    }
    return pars;
}